

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_splati_df_mips64
               (CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t n)

{
  undefined1 uVar1;
  float64 fVar2;
  long lVar3;
  fpr_t *pfVar4;
  ulong uVar5;
  ushort uVar6;
  float32 fVar7;
  undefined1 auVar8 [16];
  
  if (3 < df) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x13bf,"void msa_splat_df(uint32_t, wr_t *, wr_t *, target_ulong)");
  }
  pfVar4 = (env->active_fpu).fpr + wd;
  lVar3 = (ulong)ws * 0x10 + 0x338;
  uVar5 = (ulong)((int)(0x80L >> ((char)df + 3U & 0x3f)) - 1U & n);
  switch(df) {
  case 0:
    uVar1 = *(undefined1 *)((long)(env->active_fpu).fpr + uVar5 + lVar3 + -0x338);
    uVar6 = CONCAT11(uVar1,uVar1);
    break;
  case 1:
    uVar6 = *(ushort *)((long)(env->active_fpu).fpr + uVar5 * 2 + lVar3 + -0x338);
    break;
  case 2:
    fVar7 = *(float32 *)((long)(env->active_fpu).fpr + uVar5 * 4 + lVar3 + -0x338);
    goto LAB_008b72ff;
  case 3:
    fVar2 = *(float64 *)((long)(env->active_fpu).fpr + uVar5 * 8 + lVar3 + -0x338);
    pfVar4->fd = fVar2;
    *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = fVar2;
    return;
  }
  auVar8 = pshuflw(ZEXT216(uVar6),ZEXT216(uVar6),0);
  fVar7 = auVar8._0_4_;
LAB_008b72ff:
  pfVar4->fs[0] = fVar7;
  *(float32 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = fVar7;
  *(float32 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = fVar7;
  *(float32 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = fVar7;
  return;
}

Assistant:

void helper_msa_splati_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                          uint32_t ws, uint32_t n)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    msa_splat_df(df, pwd, pws, n);
}